

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Runner::runCurrentTest(Runner *this,string *redirectedCout,string *redirectedCerr)

{
  RunningTest *pRVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  IReporter *pIVar5;
  int iVar6;
  StreamRedirect coutRedir;
  StreamRedirect cerrRedir;
  StreamRedirect SStack_348;
  StreamRedirect local_1b8;
  
  pRVar1 = this->m_runningTest;
  pRVar1->m_runStatus = NothingRun;
  pRVar1->m_changed = false;
  pRVar1->m_lastSectionToRun = (SectionInfo *)0x0;
  sVar2 = (this->m_totals).assertions.passed;
  sVar3 = (this->m_totals).assertions.failed;
  iVar6 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((char)iVar6 == '\0') {
    (*(((this->m_runningTest->m_info->m_test).m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[4])();
  }
  else {
    StreamRedirect::StreamRedirect(&SStack_348,(ostream *)&std::cout,redirectedCout);
    StreamRedirect::StreamRedirect(&local_1b8,(ostream *)&std::cerr,redirectedCerr);
    (*(((this->m_runningTest->m_info->m_test).m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[4])();
    StreamRedirect::~StreamRedirect(&local_1b8);
    StreamRedirect::~StreamRedirect(&SStack_348);
  }
  sVar4 = (this->m_totals).assertions.failed;
  if ((sVar4 - sVar3 == sVar2 - (this->m_totals).assertions.passed) &&
     (((this->m_config->m_data).warnings & NoAssertions) != Nothing)) {
    pRVar1 = this->m_runningTest;
    if (2 < pRVar1->m_runStatus - EncounteredASection) {
      (this->m_totals).assertions.failed = sVar4 + 1;
      pIVar5 = (this->m_reporter).m_p;
      (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])
                (pIVar5,&pRVar1->m_info->m_name);
    }
  }
  RunningTest::ranToCompletion(this->m_runningTest);
  std::vector<Catch::ResultInfo,_std::allocator<Catch::ResultInfo>_>::clear(&this->m_info);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            try {
                m_runningTest->reset();
                Counts prevAssertions = m_totals.assertions;
                if( m_reporter->shouldRedirectStdout() ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_runningTest->getTestCaseInfo().invoke();
                }
                else {
                    m_runningTest->getTestCaseInfo().invoke();
                }
                Counts assertions = m_totals.assertions - prevAssertions;
                if( assertions.total() == 0  &&
                   ( m_config.data().warnings & ConfigData::WarnAbout::NoAssertions ) &&
                   !m_runningTest->hasSections() ) {
                        m_totals.assertions.failed++;
                        m_reporter->NoAssertionsInTestCase( m_runningTest->getTestCaseInfo().getName() );
                }
                m_runningTest->ranToCompletion();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                acceptMessage( getRegistryHub().getExceptionTranslatorRegistry().translateActiveException() );
                acceptResult( ResultWas::ThrewException );
            }
            m_info.clear();
        }